

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.cpp
# Opt level: O3

Reals __thiscall Omega_h::get_max_eigenvalues(Omega_h *this,Int dim,Reals *symms)

{
  int *piVar1;
  Reals *extraout_RDX;
  Alloc *pAVar2;
  Reals RVar3;
  Reals local_30;
  Reals local_20;
  
  if (dim == 1) {
    pAVar2 = (symms->write_).shared_alloc_.alloc;
    *(Alloc **)this = pAVar2;
    *(void **)(this + 8) = (symms->write_).shared_alloc_.direct_ptr;
    if ((((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar2->use_count = pAVar2->use_count + -1;
      *(size_t *)this = pAVar2->size * 8 + 1;
    }
    (symms->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (symms->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  else {
    if (dim == 2) {
      local_30.write_.shared_alloc_.alloc = (symms->write_).shared_alloc_.alloc;
      if (((ulong)local_30.write_.shared_alloc_.alloc & 7) == 0 &&
          local_30.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_30.write_.shared_alloc_.alloc =
               (Alloc *)((local_30.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_30.write_.shared_alloc_.alloc)->use_count =
               (local_30.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_30.write_.shared_alloc_.direct_ptr = (symms->write_).shared_alloc_.direct_ptr;
      RVar3 = get_max_eigenvalues_dim<2>(this,&local_30);
      symms = RVar3.write_.shared_alloc_.direct_ptr;
      pAVar2 = local_30.write_.shared_alloc_.alloc;
    }
    else {
      if (dim != 3) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.cpp"
             ,0x27);
      }
      local_20.write_.shared_alloc_.alloc = (symms->write_).shared_alloc_.alloc;
      if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
          local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_20.write_.shared_alloc_.alloc =
               (Alloc *)((local_20.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_20.write_.shared_alloc_.alloc)->use_count =
               (local_20.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_20.write_.shared_alloc_.direct_ptr = (symms->write_).shared_alloc_.direct_ptr;
      RVar3 = get_max_eigenvalues_dim<3>(this,&local_20);
      symms = RVar3.write_.shared_alloc_.direct_ptr;
      pAVar2 = local_20.write_.shared_alloc_.alloc;
    }
    if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      piVar1 = &pAVar2->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar2);
        operator_delete(pAVar2,0x48);
        symms = extraout_RDX;
      }
    }
  }
  RVar3.write_.shared_alloc_.direct_ptr = symms;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals get_max_eigenvalues(Int dim, Reals symms) {
  if (dim == 3) return get_max_eigenvalues_dim<3>(symms);
  if (dim == 2) return get_max_eigenvalues_dim<2>(symms);
  if (dim == 1) return symms;
  OMEGA_H_NORETURN(Reals());
}